

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_3da423::SerialQueueImpl::SerialQueueImpl(SerialQueueImpl *this)

{
  SerialQueueImpl *local_30;
  code *local_28;
  undefined8 local_20;
  unique_ptr<std::thread,_std::default_delete<std::thread>_> local_18;
  SerialQueueImpl *local_10;
  SerialQueueImpl *this_local;
  
  local_10 = this;
  std::unique_ptr<std::thread,std::default_delete<std::thread>>::
  unique_ptr<std::default_delete<std::thread>,void>
            ((unique_ptr<std::thread,std::default_delete<std::thread>> *)this);
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::deque
            (&this->operations);
  std::mutex::mutex(&this->operationsMutex);
  std::condition_variable::condition_variable(&this->readyOperationsCondition);
  local_28 = run;
  local_20 = 0;
  local_30 = this;
  llvm::
  make_unique<std::thread,void((anonymous_namespace)::SerialQueueImpl::*)(),(anonymous_namespace)::SerialQueueImpl*>
            ((llvm *)&local_18,(type *)&local_28,&local_30);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator=
            (&this->operationsThread,&local_18);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

SerialQueueImpl() {
    // Ensure the queue is fully initialized before creating the worker thread.
    operationsThread = llvm::make_unique<std::thread>(
        &SerialQueueImpl::run, this);
  }